

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsumst.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSumST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setupWeights(SPxSumST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *base)

{
  cpp_dec_float<50U,_int,_void> *pcVar1;
  uint *puVar2;
  int iVar3;
  Item *pIVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  SPxVectorST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  int iVar8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *v;
  ulong uVar9;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar10;
  long lVar11;
  uint uVar12;
  pointer pnVar13;
  pointer pnVar14;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar15;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar16;
  cpp_dec_float<50U,_int,_void> *pcVar17;
  pointer pnVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  bool bVar22;
  type t;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  delta;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  work;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_5;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  rowLen;
  long local_1d8;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_1c8;
  undefined1 local_188 [16];
  uint local_178 [3];
  undefined3 uStack_16b;
  uint local_168 [3];
  bool local_15c;
  undefined8 local_158;
  int local_14c;
  pointer local_148;
  pointer local_140;
  undefined1 local_138 [16];
  pointer local_128;
  long local_120;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_118;
  undefined1 local_f8 [16];
  uint local_e8 [3];
  undefined3 uStack_db;
  uint local_d8 [3];
  bool local_cc;
  undefined8 local_c8;
  undefined1 local_b8 [16];
  pointer local_a8;
  pointer local_98;
  pointer local_90;
  pointer local_88;
  cpp_dec_float<50U,_int,_void> *local_80;
  undefined1 local_78 [16];
  uint local_68 [3];
  undefined3 uStack_5b;
  uint local_58 [3];
  bool local_4c;
  undefined8 local_48;
  SPxVectorST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_38;
  
  local_48._0_4_ = cpp_dec_float_finite;
  local_48._4_4_ = 10;
  local_78 = (undefined1  [16])0x0;
  local_68[0] = 0;
  local_68[1] = 0;
  stack0xffffffffffffffa0 = 0;
  uStack_5b = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_4c = false;
  local_118.val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128 = (pointer)0x0;
  local_138 = (undefined1  [16])0x0;
  local_a8 = (pointer)0x0;
  local_b8 = (undefined1  [16])0x0;
  local_38 = &this->
              super_SPxVectorST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)local_b8,
          (base->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum,true);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim(&local_118,
          (base->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum,true);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)local_138,
          (base->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum,true);
  local_88 = local_118.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_140 = (base->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .left.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_148 = (base->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .right.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_90 = (base->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .up.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_98 = (base->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .low.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_1d8 = (long)(base->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.thenum;
  if (0 < local_1d8) {
    do {
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::length2(&local_1c8.val,
                (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)((base->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.theitem +
                   (base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thekey[local_1d8 + -1].idx));
      lVar11 = local_1d8 + -1;
      *(undefined8 *)((((pointer)(local_b8._0_8_ + lVar11 * 0x38))->m_backend).data._M_elems + 8) =
           local_1c8.val.m_backend.data._M_elems._32_8_;
      puVar2 = (((pointer)(local_b8._0_8_ + lVar11 * 0x38))->m_backend).data._M_elems + 4;
      *(undefined8 *)puVar2 = local_1c8.val.m_backend.data._M_elems._16_8_;
      *(ulong *)(puVar2 + 2) =
           CONCAT35(local_1c8.val.m_backend.data._M_elems[7]._1_3_,
                    local_1c8.val.m_backend.data._M_elems._24_5_);
      *(undefined8 *)(((pointer)(local_b8._0_8_ + lVar11 * 0x38))->m_backend).data._M_elems =
           local_1c8.val.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((((pointer)(local_b8._0_8_ + lVar11 * 0x38))->m_backend).data._M_elems + 2) =
           local_1c8.val.m_backend.data._M_elems._8_8_;
      (((pointer)(local_b8._0_8_ + lVar11 * 0x38))->m_backend).exp = local_1c8.val.m_backend.exp;
      (((pointer)(local_b8._0_8_ + lVar11 * 0x38))->m_backend).neg = local_1c8.val.m_backend.neg;
      (((pointer)(local_b8._0_8_ + lVar11 * 0x38))->m_backend).fpclass =
           local_1c8.val.m_backend.fpclass;
      (((pointer)(local_b8._0_8_ + lVar11 * 0x38))->m_backend).prec_elem =
           local_1c8.val.m_backend.prec_elem;
      if (local_140[lVar11].m_backend.fpclass == cpp_dec_float_NaN) {
LAB_0034322f:
        if (local_148[lVar11].m_backend.fpclass != cpp_dec_float_NaN) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    ((cpp_dec_float<50U,_int,_void> *)&local_1c8,0,(type *)0x0);
          pcVar17 = &local_148[lVar11].m_backend;
          iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (pcVar17,(cpp_dec_float<50U,_int,_void> *)&local_1c8);
          if (iVar8 < 0) {
            local_158._0_4_ = cpp_dec_float_finite;
            local_158._4_4_ = 10;
            local_188 = (undefined1  [16])0x0;
            local_178[0] = 0;
            local_178[1] = 0;
            stack0xfffffffffffffe90 = 0;
            uStack_16b = 0;
            local_168[0] = 0;
            local_168[1] = 0;
            local_168[2] = 0;
            local_15c = false;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      ((cpp_dec_float<50U,_int,_void> *)local_188,pcVar17,
                       (cpp_dec_float<50U,_int,_void> *)(local_b8._0_8_ + lVar11 * 0x38));
            pIVar4 = (base->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.theitem;
            iVar8 = (base->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.thekey[lVar11].idx;
            lVar20 = (long)pIVar4[iVar8].data.
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .memused;
            if (0 < lVar20) {
              pIVar4 = pIVar4 + iVar8;
              uVar21 = lVar20 + 1;
              lVar20 = lVar20 * 0x3c;
              do {
                pNVar15 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)((long)&(pIVar4->data).
                                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     .m_elem[-1].val.m_backend.data + lVar20);
                local_1c8.val.m_backend.fpclass = cpp_dec_float_finite;
                local_1c8.val.m_backend.prec_elem = 10;
                local_1c8.val.m_backend.data._M_elems[0] = 0;
                local_1c8.val.m_backend.data._M_elems[1] = 0;
                local_1c8.val.m_backend.data._M_elems[2] = 0;
                local_1c8.val.m_backend.data._M_elems[3] = 0;
                local_1c8.val.m_backend.data._M_elems[4] = 0;
                local_1c8.val.m_backend.data._M_elems[5] = 0;
                local_1c8.val.m_backend.data._M_elems._24_5_ = 0;
                local_1c8.val.m_backend.data._M_elems[7]._1_3_ = 0;
                local_1c8.val.m_backend.data._M_elems[8] = 0;
                local_1c8.val.m_backend.data._M_elems[9] = 0;
                local_1c8.val.m_backend.exp = 0;
                local_1c8.val.m_backend.neg = false;
                pNVar16 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)local_188;
                if (pNVar15 != &local_1c8) {
                  local_1c8.val.m_backend.data._M_elems[8] = local_168[0];
                  local_1c8.val.m_backend.data._M_elems[9] = local_168[1];
                  local_1c8.val.m_backend.data._M_elems[4] = local_178[0];
                  local_1c8.val.m_backend.data._M_elems[5] = local_178[1];
                  local_1c8.val.m_backend.data._M_elems._24_5_ = stack0xfffffffffffffe90;
                  local_1c8.val.m_backend.data._M_elems[7]._1_3_ = uStack_16b;
                  local_1c8.val.m_backend.data._M_elems[0] = local_188._0_4_;
                  local_1c8.val.m_backend.data._M_elems[1] = local_188._4_4_;
                  local_1c8.val.m_backend.data._M_elems[2] = local_188._8_4_;
                  local_1c8.val.m_backend.data._M_elems[3] = local_188._12_4_;
                  local_1c8.val.m_backend.exp = local_168[2];
                  local_1c8.val.m_backend.neg = local_15c;
                  local_1c8.val.m_backend.fpclass = (fpclass_type)local_158;
                  local_1c8.val.m_backend.prec_elem = local_158._4_4_;
                  pNVar16 = pNVar15;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                          ((cpp_dec_float<50U,_int,_void> *)&local_1c8,
                           (cpp_dec_float<50U,_int,_void> *)pNVar16);
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          ((cpp_dec_float<50U,_int,_void> *)
                           (local_138._0_8_ +
                           (long)*(int *)((long)(&(pIVar4->data).
                                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  .m_elem[-1].val + 1) + lVar20) * 0x38),
                           (cpp_dec_float<50U,_int,_void> *)&local_1c8);
                uVar21 = uVar21 - 1;
                lVar20 = lVar20 + -0x3c;
              } while (1 < uVar21);
            }
          }
        }
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  ((cpp_dec_float<50U,_int,_void> *)&local_1c8,0,(type *)0x0);
        pcVar17 = &local_140[lVar11].m_backend;
        iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (pcVar17,(cpp_dec_float<50U,_int,_void> *)&local_1c8);
        if (iVar8 < 1) goto LAB_0034322f;
        local_158._0_4_ = cpp_dec_float_finite;
        local_158._4_4_ = 10;
        local_188 = (undefined1  [16])0x0;
        local_178[0] = 0;
        local_178[1] = 0;
        stack0xfffffffffffffe90 = 0;
        uStack_16b = 0;
        local_168[0] = 0;
        local_168[1] = 0;
        local_168[2] = 0;
        local_15c = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((cpp_dec_float<50U,_int,_void> *)local_188,pcVar17,
                   (cpp_dec_float<50U,_int,_void> *)(local_b8._0_8_ + lVar11 * 0x38));
        pIVar4 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.theitem;
        iVar8 = (base->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thekey[lVar11].idx;
        lVar20 = (long)pIVar4[iVar8].data.
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .memused;
        if (0 < lVar20) {
          pIVar4 = pIVar4 + iVar8;
          uVar21 = lVar20 + 1;
          lVar20 = lVar20 * 0x3c;
          do {
            pNVar15 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)((long)&(pIVar4->data).
                                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .m_elem[-1].val.m_backend.data + lVar20);
            local_1c8.val.m_backend.fpclass = cpp_dec_float_finite;
            local_1c8.val.m_backend.prec_elem = 10;
            local_1c8.val.m_backend.data._M_elems[0] = 0;
            local_1c8.val.m_backend.data._M_elems[1] = 0;
            local_1c8.val.m_backend.data._M_elems[2] = 0;
            local_1c8.val.m_backend.data._M_elems[3] = 0;
            local_1c8.val.m_backend.data._M_elems[4] = 0;
            local_1c8.val.m_backend.data._M_elems[5] = 0;
            local_1c8.val.m_backend.data._M_elems._24_5_ = 0;
            local_1c8.val.m_backend.data._M_elems[7]._1_3_ = 0;
            local_1c8.val.m_backend.data._M_elems[8] = 0;
            local_1c8.val.m_backend.data._M_elems[9] = 0;
            local_1c8.val.m_backend.exp = 0;
            local_1c8.val.m_backend.neg = false;
            pNVar16 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)local_188;
            if (pNVar15 != &local_1c8) {
              local_1c8.val.m_backend.data._M_elems[8] = local_168[0];
              local_1c8.val.m_backend.data._M_elems[9] = local_168[1];
              local_1c8.val.m_backend.data._M_elems[4] = local_178[0];
              local_1c8.val.m_backend.data._M_elems[5] = local_178[1];
              local_1c8.val.m_backend.data._M_elems._24_5_ = stack0xfffffffffffffe90;
              local_1c8.val.m_backend.data._M_elems[7]._1_3_ = uStack_16b;
              local_1c8.val.m_backend.data._M_elems[0] = local_188._0_4_;
              local_1c8.val.m_backend.data._M_elems[1] = local_188._4_4_;
              local_1c8.val.m_backend.data._M_elems[2] = local_188._8_4_;
              local_1c8.val.m_backend.data._M_elems[3] = local_188._12_4_;
              local_1c8.val.m_backend.exp = local_168[2];
              local_1c8.val.m_backend.neg = local_15c;
              local_1c8.val.m_backend.fpclass = (fpclass_type)local_158;
              local_1c8.val.m_backend.prec_elem = local_158._4_4_;
              pNVar16 = pNVar15;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      ((cpp_dec_float<50U,_int,_void> *)&local_1c8,
                       (cpp_dec_float<50U,_int,_void> *)pNVar16);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      ((cpp_dec_float<50U,_int,_void> *)
                       (local_138._0_8_ +
                       (long)*(int *)((long)(&(pIVar4->data).
                                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                              .m_elem[-1].val + 1) + lVar20) * 0x38),
                       (cpp_dec_float<50U,_int,_void> *)&local_1c8);
            uVar21 = uVar21 - 1;
            lVar20 = lVar20 + -0x3c;
          } while (1 < uVar21);
        }
      }
      bVar22 = 1 < local_1d8;
      local_1d8 = lVar11;
    } while (bVar22);
  }
  local_98 = local_98 + -1;
  local_90 = local_90 + -1;
  local_88 = local_88 + -1;
  local_14c = 0;
  do {
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::operator+=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  *)&local_118,
                 (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)local_138);
    lVar11 = (long)(base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum;
    if (0 < lVar11) {
      lVar20 = lVar11 * 0x38;
      uVar21 = lVar11 + 1;
      pnVar13 = local_98;
      pnVar14 = local_88;
      pnVar18 = local_90;
      local_120 = lVar20;
      do {
        pcVar17 = (cpp_dec_float<50U,_int,_void> *)
                  ((long)(pnVar14->m_backend).data._M_elems + lVar20);
        uVar12 = *(uint *)((long)(&(pnVar14->m_backend).data + 1) + lVar20 + 8);
        uVar9 = (ulong)uVar12;
        if ((uVar12 != 2) && (*(int *)((long)&(pnVar18->m_backend).data + lVar20 + 0x30) != 2)) {
          pcVar1 = (cpp_dec_float<50U,_int,_void> *)((long)&(pnVar18->m_backend).data + lVar20);
          local_80 = pcVar17;
          iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (pcVar17,pcVar1);
          lVar20 = local_120;
          pcVar17 = local_80;
          if (iVar8 < 1) {
            uVar9 = (ulong)local_80->fpclass;
          }
          else {
            *(undefined8 *)((local_80->data)._M_elems + 8) =
                 *(undefined8 *)((pcVar1->data)._M_elems + 8);
            uVar5 = *(undefined8 *)(pcVar1->data)._M_elems;
            uVar6 = *(undefined8 *)((pcVar1->data)._M_elems + 2);
            uVar7 = *(undefined8 *)((pcVar1->data)._M_elems + 6);
            *(undefined8 *)((local_80->data)._M_elems + 4) =
                 *(undefined8 *)((pcVar1->data)._M_elems + 4);
            *(undefined8 *)((local_80->data)._M_elems + 6) = uVar7;
            *(undefined8 *)(local_80->data)._M_elems = uVar5;
            *(undefined8 *)((local_80->data)._M_elems + 2) = uVar6;
            *(undefined4 *)((long)(&(pnVar14->m_backend).data + 1) + local_120) =
                 *(undefined4 *)((long)&(pnVar18->m_backend).data + local_120 + 0x28);
            *(undefined1 *)((long)(&(pnVar14->m_backend).data + 1) + local_120 + 4) =
                 *(undefined1 *)((long)&(pnVar18->m_backend).data + local_120 + 0x2c);
            uVar9 = *(ulong *)((long)&(pnVar18->m_backend).data + local_120 + 0x30);
            *(ulong *)((long)(&(pnVar14->m_backend).data + 1) + local_120 + 8) = uVar9;
          }
        }
        if (((int)uVar9 != 2) && (*(int *)((long)&(pnVar13->m_backend).data + lVar20 + 0x30) != 2))
        {
          pcVar1 = (cpp_dec_float<50U,_int,_void> *)((long)&(pnVar13->m_backend).data + lVar20);
          iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (pcVar17,pcVar1);
          lVar20 = local_120;
          if (iVar8 < 0) {
            *(undefined8 *)((pcVar17->data)._M_elems + 8) =
                 *(undefined8 *)((pcVar1->data)._M_elems + 8);
            uVar5 = *(undefined8 *)(pcVar1->data)._M_elems;
            uVar6 = *(undefined8 *)((pcVar1->data)._M_elems + 2);
            uVar7 = *(undefined8 *)((pcVar1->data)._M_elems + 6);
            *(undefined8 *)((pcVar17->data)._M_elems + 4) =
                 *(undefined8 *)((pcVar1->data)._M_elems + 4);
            *(undefined8 *)((pcVar17->data)._M_elems + 6) = uVar7;
            *(undefined8 *)(pcVar17->data)._M_elems = uVar5;
            *(undefined8 *)((pcVar17->data)._M_elems + 2) = uVar6;
            *(undefined4 *)((long)(&(pnVar14->m_backend).data + 1) + local_120) =
                 *(undefined4 *)((long)&(pnVar13->m_backend).data + local_120 + 0x28);
            *(undefined1 *)((long)(&(pnVar14->m_backend).data + 1) + local_120 + 4) =
                 *(undefined1 *)((long)&(pnVar13->m_backend).data + local_120 + 0x2c);
            *(undefined8 *)((long)(&(pnVar14->m_backend).data + 1) + local_120 + 8) =
                 *(undefined8 *)((long)&(pnVar13->m_backend).data + local_120 + 0x30);
          }
        }
        uVar21 = uVar21 - 1;
        pnVar13 = pnVar13 + -1;
        pnVar18 = pnVar18 + -1;
        pnVar14 = pnVar14 + -1;
      } while (1 < uVar21);
    }
    this_00 = local_38;
    if (local_14c == 0xc) {
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator=(&local_38->vec,&local_118);
      this_00->state = PVEC;
      SPxVectorST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setupWeights(this_00,base);
      if ((pointer)local_b8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_b8._0_8_,(long)local_a8 - local_b8._0_8_);
      }
      if ((pointer)local_138._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_138._0_8_,(long)local_128 - local_138._0_8_);
      }
      if (local_118.val.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_118.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_118.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_118.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
    for (pnVar13 = (pointer)local_138._0_8_; pnVar13 != (pointer)local_138._8_8_;
        pnVar13 = pnVar13 + 1) {
      (pnVar13->m_backend).fpclass = cpp_dec_float_finite;
      (pnVar13->m_backend).prec_elem = 10;
      (pnVar13->m_backend).data._M_elems[0] = 0;
      (pnVar13->m_backend).data._M_elems[1] = 0;
      (pnVar13->m_backend).data._M_elems[2] = 0;
      (pnVar13->m_backend).data._M_elems[3] = 0;
      pcVar17 = &pnVar13->m_backend;
      (pcVar17->data)._M_elems[4] = 0;
      (pcVar17->data)._M_elems[5] = 0;
      (pcVar17->data)._M_elems[6] = 0;
      (pcVar17->data)._M_elems[7] = 0;
      *(undefined1 (*) [16])((long)(pnVar13->m_backend).data._M_elems + 0x1d) =
           (undefined1  [16])0x0;
    }
    bVar22 = false;
    lVar11 = (long)(base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum;
    while (lVar11 != 0 && bVar22 == lVar11 < 0) {
      pIVar4 = (base->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.theitem;
      iVar8 = (base->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thekey[lVar11 + -1].idx;
      local_1c8.val.m_backend.fpclass = cpp_dec_float_finite;
      local_1c8.val.m_backend.prec_elem = 10;
      local_1c8.val.m_backend.data._M_elems[0] = 0;
      local_1c8.val.m_backend.data._M_elems[1] = 0;
      local_1c8.val.m_backend.data._M_elems[2] = 0;
      local_1c8.val.m_backend.data._M_elems[3] = 0;
      local_1c8.val.m_backend.data._M_elems[4] = 0;
      local_1c8.val.m_backend.data._M_elems[5] = 0;
      local_1c8.val.m_backend.data._M_elems._24_5_ = 0;
      local_1c8.val.m_backend.data._M_elems[7]._1_3_ = 0;
      local_1c8.val.m_backend.data._M_elems[8] = 0;
      local_1c8.val.m_backend.data._M_elems[9] = 0;
      local_1c8.val.m_backend.exp = 0;
      local_1c8.val.m_backend.neg = false;
      iVar3 = pIVar4[iVar8].data.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused;
      if (0 < iVar3) {
        pNVar16 = pIVar4[iVar8].data.
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .m_elem;
        uVar12 = iVar3 + 1;
        do {
          pNVar10 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)(local_118.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + pNVar16->idx);
          local_158._0_4_ = cpp_dec_float_finite;
          local_158._4_4_ = 10;
          local_188 = (undefined1  [16])0x0;
          local_178[0] = 0;
          local_178[1] = 0;
          stack0xfffffffffffffe90 = 0;
          uStack_16b = 0;
          local_168[0] = 0;
          local_168[1] = 0;
          local_168[2] = 0;
          local_15c = false;
          pNVar15 = pNVar16;
          if (((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)local_188 != pNVar10) &&
             (pNVar15 = pNVar10,
             pNVar16 !=
             (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)local_188)) {
            local_168._0_8_ = *(undefined8 *)((pNVar16->val).m_backend.data._M_elems + 8);
            local_188 = *(undefined1 (*) [16])(pNVar16->val).m_backend.data._M_elems;
            local_178._0_8_ = *(undefined8 *)((pNVar16->val).m_backend.data._M_elems + 4);
            uVar5 = *(undefined8 *)((pNVar16->val).m_backend.data._M_elems + 6);
            stack0xfffffffffffffe90 = (undefined5)uVar5;
            uStack_16b = (undefined3)((ulong)uVar5 >> 0x28);
            local_168[2] = (pNVar16->val).m_backend.exp;
            local_15c = (pNVar16->val).m_backend.neg;
            local_158._0_4_ = (pNVar16->val).m_backend.fpclass;
            local_158._4_4_ = (pNVar16->val).m_backend.prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    ((cpp_dec_float<50U,_int,_void> *)local_188,
                     (cpp_dec_float<50U,_int,_void> *)pNVar15);
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    ((cpp_dec_float<50U,_int,_void> *)&local_1c8,
                     (cpp_dec_float<50U,_int,_void> *)local_188);
          pNVar16 = pNVar16 + 1;
          uVar12 = uVar12 - 1;
        } while (1 < uVar12);
      }
      lVar20 = lVar11 + -1;
      local_58[0] = local_1c8.val.m_backend.data._M_elems[8];
      local_58[1] = local_1c8.val.m_backend.data._M_elems[9];
      local_68[0] = local_1c8.val.m_backend.data._M_elems[4];
      local_68[1] = local_1c8.val.m_backend.data._M_elems[5];
      stack0xffffffffffffffa0 = local_1c8.val.m_backend.data._M_elems._24_5_;
      uStack_5b = local_1c8.val.m_backend.data._M_elems[7]._1_3_;
      local_78._0_4_ = local_1c8.val.m_backend.data._M_elems[0];
      local_78._4_4_ = local_1c8.val.m_backend.data._M_elems[1];
      local_78._8_4_ = local_1c8.val.m_backend.data._M_elems[2];
      local_78._12_4_ = local_1c8.val.m_backend.data._M_elems[3];
      local_48._0_4_ = local_1c8.val.m_backend.fpclass;
      local_58[2] = local_1c8.val.m_backend.exp;
      local_4c = local_1c8.val.m_backend.neg;
      uVar5 = local_1c8.val.m_backend._48_8_;
      if ((local_140[lVar20].m_backend.fpclass == cpp_dec_float_NaN) ||
         (uVar5 = local_1c8.val.m_backend._48_8_, (fpclass_type)local_48 == cpp_dec_float_NaN)) {
LAB_003438d1:
        local_48 = uVar5;
        if ((local_148[lVar20].m_backend.fpclass != cpp_dec_float_NaN) &&
           (bVar22 = (fpclass_type)local_48 != cpp_dec_float_NaN, bVar22)) {
          pcVar17 = &local_148[lVar20].m_backend;
          iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (pcVar17,(cpp_dec_float<50U,_int,_void> *)local_78);
          if (iVar8 < 0) {
            local_c8._0_4_ = cpp_dec_float_finite;
            local_c8._4_4_ = 10;
            local_f8 = (undefined1  [16])0x0;
            local_e8[0] = 0;
            local_e8[1] = 0;
            stack0xffffffffffffff20 = 0;
            uStack_db = 0;
            local_d8[0] = 0;
            local_d8[1] = 0;
            local_d8[2] = 0;
            local_cc = false;
            if ((cpp_dec_float<50U,_int,_void> *)local_f8 != pcVar17) {
              local_d8._0_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 8);
              local_f8 = *(undefined1 (*) [16])(pcVar17->data)._M_elems;
              local_e8._0_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 4);
              uVar5 = *(undefined8 *)((pcVar17->data)._M_elems + 6);
              stack0xffffffffffffff20 = (undefined5)uVar5;
              uStack_db = (undefined3)((ulong)uVar5 >> 0x28);
              local_d8[2] = pcVar17->exp;
              local_cc = pcVar17->neg;
              local_c8._0_4_ = pcVar17->fpclass;
              local_c8._4_4_ = pcVar17->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      ((cpp_dec_float<50U,_int,_void> *)local_f8,
                       (cpp_dec_float<50U,_int,_void> *)local_78);
            local_158._0_4_ = cpp_dec_float_finite;
            local_158._4_4_ = 10;
            local_188 = (undefined1  [16])0x0;
            local_178[0] = 0;
            local_178[1] = 0;
            stack0xfffffffffffffe90 = 0;
            uStack_16b = 0;
            local_168[0] = 0;
            local_168[1] = 0;
            local_168[2] = 0;
            local_15c = false;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      ((cpp_dec_float<50U,_int,_void> *)local_188,
                       (cpp_dec_float<50U,_int,_void> *)local_f8,
                       (cpp_dec_float<50U,_int,_void> *)(local_b8._0_8_ + lVar20 * 0x38));
            pIVar4 = (base->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.theitem;
            iVar8 = (base->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.thekey[lVar20].idx;
            lVar19 = (long)pIVar4[iVar8].data.
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .memused;
            if (0 < lVar19) {
              pIVar4 = pIVar4 + iVar8;
              uVar21 = lVar19 + 1;
              lVar19 = lVar19 * 0x3c;
              do {
                pNVar15 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)((long)&(pIVar4->data).
                                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     .m_elem[-1].val.m_backend.data + lVar19);
                local_1c8.val.m_backend.fpclass = cpp_dec_float_finite;
                local_1c8.val.m_backend.prec_elem = 10;
                local_1c8.val.m_backend.data._M_elems[0] = 0;
                local_1c8.val.m_backend.data._M_elems[1] = 0;
                local_1c8.val.m_backend.data._M_elems[2] = 0;
                local_1c8.val.m_backend.data._M_elems[3] = 0;
                local_1c8.val.m_backend.data._M_elems[4] = 0;
                local_1c8.val.m_backend.data._M_elems[5] = 0;
                local_1c8.val.m_backend.data._M_elems._24_5_ = 0;
                local_1c8.val.m_backend.data._M_elems[7]._1_3_ = 0;
                local_1c8.val.m_backend.data._M_elems[8] = 0;
                local_1c8.val.m_backend.data._M_elems[9] = 0;
                local_1c8.val.m_backend.exp = 0;
                local_1c8.val.m_backend.neg = false;
                pNVar16 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)local_188;
                if (pNVar15 != &local_1c8) {
                  local_1c8.val.m_backend.data._M_elems[8] = local_168[0];
                  local_1c8.val.m_backend.data._M_elems[9] = local_168[1];
                  local_1c8.val.m_backend.data._M_elems[4] = local_178[0];
                  local_1c8.val.m_backend.data._M_elems[5] = local_178[1];
                  local_1c8.val.m_backend.data._M_elems._24_5_ = stack0xfffffffffffffe90;
                  local_1c8.val.m_backend.data._M_elems[7]._1_3_ = uStack_16b;
                  local_1c8.val.m_backend.data._M_elems[0] = local_188._0_4_;
                  local_1c8.val.m_backend.data._M_elems[1] = local_188._4_4_;
                  local_1c8.val.m_backend.data._M_elems[2] = local_188._8_4_;
                  local_1c8.val.m_backend.data._M_elems[3] = local_188._12_4_;
                  local_1c8.val.m_backend.exp = local_168[2];
                  local_1c8.val.m_backend.neg = local_15c;
                  local_1c8.val.m_backend.fpclass = (fpclass_type)local_158;
                  local_1c8.val.m_backend.prec_elem = local_158._4_4_;
                  pNVar16 = pNVar15;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                          ((cpp_dec_float<50U,_int,_void> *)&local_1c8,
                           (cpp_dec_float<50U,_int,_void> *)pNVar16);
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          ((cpp_dec_float<50U,_int,_void> *)
                           (local_138._0_8_ +
                           (long)*(int *)((long)(&(pIVar4->data).
                                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  .m_elem[-1].val + 1) + lVar19) * 0x38),
                           (cpp_dec_float<50U,_int,_void> *)&local_1c8);
                uVar21 = uVar21 - 1;
                lVar19 = lVar19 + -0x3c;
              } while (1 < uVar21);
            }
          }
        }
      }
      else {
        pcVar17 = &local_140[lVar20].m_backend;
        local_48 = local_1c8.val.m_backend._48_8_;
        iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (pcVar17,(cpp_dec_float<50U,_int,_void> *)local_78);
        if (iVar8 < 1) {
          uVar5 = local_48;
          goto LAB_003438d1;
        }
        local_c8._0_4_ = cpp_dec_float_finite;
        local_c8._4_4_ = 10;
        local_f8 = (undefined1  [16])0x0;
        local_e8[0] = 0;
        local_e8[1] = 0;
        stack0xffffffffffffff20 = 0;
        uStack_db = 0;
        local_d8[0] = 0;
        local_d8[1] = 0;
        local_d8[2] = 0;
        local_cc = false;
        if ((cpp_dec_float<50U,_int,_void> *)local_f8 != pcVar17) {
          local_d8._0_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 8);
          local_f8 = *(undefined1 (*) [16])(pcVar17->data)._M_elems;
          local_e8._0_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 4);
          uVar5 = *(undefined8 *)((pcVar17->data)._M_elems + 6);
          stack0xffffffffffffff20 = (undefined5)uVar5;
          uStack_db = (undefined3)((ulong)uVar5 >> 0x28);
          local_d8[2] = pcVar17->exp;
          local_cc = pcVar17->neg;
          local_c8._0_4_ = pcVar17->fpclass;
          local_c8._4_4_ = pcVar17->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  ((cpp_dec_float<50U,_int,_void> *)local_f8,
                   (cpp_dec_float<50U,_int,_void> *)local_78);
        local_158._0_4_ = cpp_dec_float_finite;
        local_158._4_4_ = 10;
        local_188 = (undefined1  [16])0x0;
        local_178[0] = 0;
        local_178[1] = 0;
        stack0xfffffffffffffe90 = 0;
        uStack_16b = 0;
        local_168[0] = 0;
        local_168[1] = 0;
        local_168[2] = 0;
        local_15c = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((cpp_dec_float<50U,_int,_void> *)local_188,
                   (cpp_dec_float<50U,_int,_void> *)local_f8,
                   (cpp_dec_float<50U,_int,_void> *)(local_b8._0_8_ + lVar20 * 0x38));
        pIVar4 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.theitem;
        iVar8 = (base->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thekey[lVar20].idx;
        lVar19 = (long)pIVar4[iVar8].data.
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .memused;
        if (0 < lVar19) {
          pIVar4 = pIVar4 + iVar8;
          uVar21 = lVar19 + 1;
          lVar19 = lVar19 * 0x3c;
          do {
            pNVar15 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)((long)&(pIVar4->data).
                                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .m_elem[-1].val.m_backend.data + lVar19);
            local_1c8.val.m_backend.fpclass = cpp_dec_float_finite;
            local_1c8.val.m_backend.prec_elem = 10;
            local_1c8.val.m_backend.data._M_elems[0] = 0;
            local_1c8.val.m_backend.data._M_elems[1] = 0;
            local_1c8.val.m_backend.data._M_elems[2] = 0;
            local_1c8.val.m_backend.data._M_elems[3] = 0;
            local_1c8.val.m_backend.data._M_elems[4] = 0;
            local_1c8.val.m_backend.data._M_elems[5] = 0;
            local_1c8.val.m_backend.data._M_elems._24_5_ = 0;
            local_1c8.val.m_backend.data._M_elems[7]._1_3_ = 0;
            local_1c8.val.m_backend.data._M_elems[8] = 0;
            local_1c8.val.m_backend.data._M_elems[9] = 0;
            local_1c8.val.m_backend.exp = 0;
            local_1c8.val.m_backend.neg = false;
            pNVar16 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)local_188;
            if (pNVar15 != &local_1c8) {
              local_1c8.val.m_backend.data._M_elems[8] = local_168[0];
              local_1c8.val.m_backend.data._M_elems[9] = local_168[1];
              local_1c8.val.m_backend.data._M_elems[4] = local_178[0];
              local_1c8.val.m_backend.data._M_elems[5] = local_178[1];
              local_1c8.val.m_backend.data._M_elems._24_5_ = stack0xfffffffffffffe90;
              local_1c8.val.m_backend.data._M_elems[7]._1_3_ = uStack_16b;
              local_1c8.val.m_backend.data._M_elems[0] = local_188._0_4_;
              local_1c8.val.m_backend.data._M_elems[1] = local_188._4_4_;
              local_1c8.val.m_backend.data._M_elems[2] = local_188._8_4_;
              local_1c8.val.m_backend.data._M_elems[3] = local_188._12_4_;
              local_1c8.val.m_backend.exp = local_168[2];
              local_1c8.val.m_backend.neg = local_15c;
              local_1c8.val.m_backend.fpclass = (fpclass_type)local_158;
              local_1c8.val.m_backend.prec_elem = local_158._4_4_;
              pNVar16 = pNVar15;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      ((cpp_dec_float<50U,_int,_void> *)&local_1c8,
                       (cpp_dec_float<50U,_int,_void> *)pNVar16);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      ((cpp_dec_float<50U,_int,_void> *)
                       (local_138._0_8_ +
                       (long)*(int *)((long)(&(pIVar4->data).
                                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                              .m_elem[-1].val + 1) + lVar19) * 0x38),
                       (cpp_dec_float<50U,_int,_void> *)&local_1c8);
            uVar21 = uVar21 - 1;
            lVar19 = lVar19 + -0x3c;
          } while (1 < uVar21);
        }
      }
      bVar22 = SBORROW8(lVar11,1);
      lVar11 = lVar20;
    }
    local_14c = local_14c + 1;
  } while( true );
}

Assistant:

void SPxSumST<R>::setupWeights(SPxSolverBase<R>& base)
{
   int count;
   int i;
   R x;
   VectorBase<R> work, delta, rowLen;

   assert(base.nRows() > 0);
   assert(base.nCols() > 0);

   rowLen.reDim(base.nRows(), true);
   work.reDim(base.nCols(), true);
   delta.reDim(base.nCols(), true);

   R* wrk = work.get_ptr();
   const R* lhs = base.lhs().get_const_ptr();
   const R* rhs = base.rhs().get_const_ptr();
   const R* up = base.upper().get_const_ptr();
   const R* low = base.lower().get_const_ptr();

   for(i = base.nRows(); --i >= 0;)
   {
      rowLen[i] = base.rowVector(i).length2();

      if(lhs[i] > 0)
         delta.multAdd(lhs[i] / rowLen[i], base.rowVector(i));
      else if(rhs[i] < 0)
         delta.multAdd(rhs[i] / rowLen[i], base.rowVector(i));
   }

   for(count = 0;; count++)
   {
      work += delta;

      for(i = base.nCols(); --i >= 0;)
      {
         if(wrk[i] > up[i])
            wrk[i] = up[i];

         if(wrk[i] < low[i])
            wrk[i] = low[i];
      }

      //      std::cout << -(work * base.maxObj()) << std::endl;
      if(count >= 12)
         break;

      delta.clear();

      for(i = base.nRows(); --i >= 0;)
      {
         x = base.rowVector(i) * work;

         if(lhs[i] > x)
            delta.multAdd((lhs[i] - x) / rowLen[i], base.rowVector(i));
         else if(rhs[i] < x)
            delta.multAdd((rhs[i] - x) / rowLen[i], base.rowVector(i));
      }
   }

   this->primal(work);
   SPxVectorST<R>::setupWeights(base);
}